

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operats.c
# Opt level: O3

Matrix * Transp_M(Matrix *M)

{
  ElType **ppEVar1;
  LASErrIdType LVar2;
  Matrix *M_00;
  char *pcVar3;
  size_t sVar4;
  char *Object1Name;
  ElOrderType EVar5;
  
  M_Lock(M);
  LVar2 = LASResult();
  if (LVar2 != LASOK) {
    M_00 = (Matrix *)0x0;
    goto LAB_0010d219;
  }
  M_00 = (Matrix *)malloc(0x50);
  pcVar3 = M_GetName(M);
  sVar4 = strlen(pcVar3);
  pcVar3 = (char *)malloc(sVar4 + 10);
  Object1Name = M_GetName(M);
  if (pcVar3 == (char *)0x0 || M_00 == (Matrix *)0x0) {
    LASError(LASMemAllocErr,"Transp_M",Object1Name,(char *)0x0,(char *)0x0);
    if (M_00 != (Matrix *)0x0) {
      free(M_00);
    }
    if (pcVar3 == (char *)0x0) goto LAB_0010d219;
  }
  else {
    sprintf(pcVar3,"(%s)^T",Object1Name);
    EVar5 = Clmws;
    M_Constr(M_00,pcVar3,M->ClmDim,M->RowDim,M->ElOrder,Tempor,False);
    LVar2 = LASResult();
    if (LVar2 == LASOK) {
      if (M->ElOrder == Rowws) {
LAB_0010d1a9:
        M_00->ElOrder = EVar5;
      }
      else if (M->ElOrder == Clmws) {
        EVar5 = Rowws;
        goto LAB_0010d1a9;
      }
      M_00->Multipl = M->Multipl;
      if ((M->Instance == Tempor) && (M->OwnData != False)) {
        M->OwnData = False;
        M_00->OwnData = True;
      }
      ppEVar1 = M->El;
      M_00->Len = M->Len;
      M_00->El = ppEVar1;
      M_00->ElSorted = M->ElSorted;
    }
  }
  free(pcVar3);
LAB_0010d219:
  M_Unlock(M);
  return M_00;
}

Assistant:

Matrix *Transp_M(Matrix *M)
/* MRes = M^T, returns transposed matrix M */
{
    Matrix *MRes;

    char *MResName;

    M_Lock(M);
    
    if (LASResult() == LASOK) {
        MRes = (Matrix *)malloc(sizeof(Matrix));
        MResName = (char *)malloc((strlen(M_GetName(M)) + 10) * sizeof(char));
        if (MRes != NULL && MResName != NULL) {
            sprintf(MResName, "(%s)^T", M_GetName(M));
            M_Constr(MRes, MResName,  M->ClmDim, M->RowDim, M->ElOrder, Tempor, False);
            if (LASResult() == LASOK) {
                if (M->ElOrder == Rowws)
                    MRes->ElOrder = Clmws;
                if (M->ElOrder == Clmws)
                    MRes->ElOrder = Rowws;
                MRes->Multipl = M->Multipl;
                if (M->Instance == Tempor && M->OwnData) {
                    M->OwnData = False;
                    MRes->OwnData = True;
                }
                MRes->Len = M->Len;
                MRes->El = M->El;
                MRes->ElSorted = M->ElSorted;
            }
        } else {
            LASError(LASMemAllocErr, "Transp_M", M_GetName(M), NULL, NULL);
            if (MRes != NULL)
                free(MRes);
        }
            
        if (MResName != NULL)
            free(MResName);
    } else {
        MRes = NULL;
    }

    M_Unlock(M);

    return(MRes);
}